

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

_Bool rf_is_model_animation_valid(rf_model model,rf_model_animation anim)

{
  bool bVar1;
  long lVar2;
  
  if (model.bone_count != anim.bone_count) {
    return false;
  }
  bVar1 = model.bone_count < 1;
  if (0 < model.bone_count) {
    lVar2 = 0x20;
    do {
      if (*(long *)((model.bones)->name + lVar2) != *(long *)((anim.bones)->name + lVar2)) {
        return false;
      }
      lVar2 = lVar2 + 0x28;
      model.bone_count = model.bone_count + -1;
    } while (model.bone_count != 0);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

RF_API bool rf_is_model_animation_valid(rf_model model, rf_model_animation anim)
{
    int result = true;

    if (model.bone_count != anim.bone_count) result = false;
    else
    {
        for (rf_int i = 0; i < model.bone_count; i++)
        {
            if (model.bones[i].parent != anim.bones[i].parent) { result = false; break; }
        }
    }

    return result;
}